

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

void Glucose_ReadDimacs(char *pFileName,SimpSolver *s)

{
  char cVar1;
  char *this;
  int iVar2;
  bool bVar3;
  Lit local_40;
  int local_3c;
  int local_38;
  int VarMax;
  int Var;
  int fComp;
  char *pTemp;
  char *pBuffer;
  vec<Gluco::Lit> *lits;
  SimpSolver *s_local;
  char *pFileName_local;
  
  pBuffer = (char *)&(s->super_Solver).user_lits;
  lits = (vec<Gluco::Lit> *)s;
  s_local = (SimpSolver *)pFileName;
  pTemp = Extra_FileReadContents(pFileName);
  local_3c = 0;
  Gluco::vec<Gluco::Lit>::clear((vec<Gluco::Lit> *)pBuffer,false);
  for (_Var = pTemp; *_Var != '\0'; _Var = _Var + 1) {
    if ((*_Var == 'c') || (*_Var == 'p')) {
      for (; *_Var != '\n'; _Var = _Var + 1) {
      }
    }
    else {
      while( true ) {
        bVar3 = true;
        if (((*_Var != ' ') && (bVar3 = true, *_Var != '\t')) && (bVar3 = true, *_Var != '\r')) {
          bVar3 = *_Var == '\n';
        }
        if (!bVar3) break;
        _Var = _Var + 1;
      }
      cVar1 = *_Var;
      if (cVar1 == '-') {
        _Var = _Var + 1;
      }
      VarMax = (int)(cVar1 == '-');
      if (*_Var == '+') {
        _Var = _Var + 1;
      }
      local_38 = atoi(_Var);
      if (local_38 == 0) {
        iVar2 = Gluco::vec<Gluco::Lit>::size((vec<Gluco::Lit> *)pBuffer);
        if (0 < iVar2) {
          Gluco::SimpSolver::addVar((SimpSolver *)lits,local_3c);
          Gluco::SimpSolver::addClause((SimpSolver *)lits,(vec<Gluco::Lit> *)pBuffer);
          Gluco::vec<Gluco::Lit>::clear((vec<Gluco::Lit> *)pBuffer,false);
        }
      }
      else {
        local_38 = local_38 + -1;
        local_3c = Abc_MaxInt(local_3c,local_38);
        this = pBuffer;
        iVar2 = Abc_Var2Lit(local_38,VarMax);
        local_40 = Gluco::toLit(iVar2);
        Gluco::vec<Gluco::Lit>::push((vec<Gluco::Lit> *)this,&local_40);
      }
      while( true ) {
        bVar3 = false;
        if ('/' < *_Var) {
          bVar3 = *_Var < ':';
        }
        if (!bVar3) break;
        _Var = _Var + 1;
      }
    }
  }
  if (pTemp != (char *)0x0) {
    free(pTemp);
  }
  return;
}

Assistant:

void Glucose_ReadDimacs( char * pFileName, SimpSolver& s )
{
    vec<Lit> * lits = &s.user_lits;
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pTemp; int fComp, Var, VarMax = 0;
    lits->clear();
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == 'c' || *pTemp == 'p' ) {
            while ( *pTemp != '\n' )
                pTemp++;
            continue;
        }
        while ( *pTemp == ' ' || *pTemp == '\t' || *pTemp == '\r' || *pTemp == '\n' )
            pTemp++;
        fComp = 0;
        if ( *pTemp == '-' )
            fComp = 1, pTemp++;
        if ( *pTemp == '+' )
            pTemp++;
        Var = atoi( pTemp );
        if ( Var == 0 ) {
            if ( lits->size() > 0 ) {
                s.addVar( VarMax );
                s.addClause(*lits);
                lits->clear();
            }
        }
        else {
            Var--;
            VarMax = Abc_MaxInt( VarMax, Var );
            lits->push( toLit(Abc_Var2Lit(Var, fComp)) );
        }
        while ( *pTemp >= '0' && *pTemp <= '9' )
            pTemp++;
    }
    ABC_FREE( pBuffer );
}